

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_File_Device::Fl_PostScript_File_Device(Fl_PostScript_File_Device *this)

{
  Fl_Graphics_Driver *this_00;
  
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver = (Fl_Graphics_Driver *)0x0;
  (this->super_Fl_Paged_Device).x_offset = 0;
  (this->super_Fl_Paged_Device).y_offset = 0;
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device.super_Fl_Device._vptr_Fl_Device =
       (_func_int **)&PTR_class_name_0027b340;
  this_00 = (Fl_Graphics_Driver *)operator_new(0x870);
  Fl_Graphics_Driver::Fl_Graphics_Driver(this_00);
  (this_00->super_Fl_Device)._vptr_Fl_Device = (_func_int **)&PTR_class_name_0027b150;
  this_00[1].stack[6].d = 0.0;
  this_00[1].font_ = 2;
  this_00[1].stack[6].b = 0.0;
  this_00[1].stack[8].a = 0.0;
  *(undefined8 *)((long)&this_00[1].stack[6].y + 4) = 0x3f8000003f800000;
  *(undefined1 *)((long)&this_00[1].stack[7].y + 2) = 0xff;
  *(undefined2 *)&this_00[1].stack[7].y = 0xffff;
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver = this_00;
  return;
}

Assistant:

Fl_PostScript_File_Device::Fl_PostScript_File_Device(void)
{
#ifdef __APPLE__
  gc = fl_gc; // the display context is used by fl_text_extents()
#endif
  Fl_Surface_Device::driver( new Fl_PostScript_Graphics_Driver() );
}